

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O1

bool __thiscall ON_Buffer::ReadFromBinaryArchive(ON_Buffer *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  ON__UINT32 OVar2;
  ON__UINT64 OVar3;
  ulong uVar4;
  int iVar5;
  byte bVar6;
  ulong count;
  void *p;
  ON__UINT64 saved_buffer_size;
  ON__UINT32 saved_buffer_crc;
  int minor_version;
  int major_version;
  ON__UINT64 local_80;
  ON__UINT32 local_74;
  int local_70;
  int local_6c;
  ulong local_68;
  size_t local_60;
  ON_3DM_BIG_CHUNK local_58;
  
  ChangeSize(this,0);
  local_6c = 0;
  local_70 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x28100,&local_6c,&local_70);
  if (!bVar1) {
    return false;
  }
  local_58.m_big_value = 0;
  local_58.m_typecode = 0;
  local_58.m_bLongChunk = '\0';
  local_58.m_reserved1 = '\0';
  local_58.m_reserved2 = '\0';
  local_58.m_reserved3 = '\0';
  local_58.m_start_offset = 0;
  local_58.m_end_offset = 0;
  bVar6 = 0;
  local_58.m_do_crc16 = '\0';
  local_58.m_do_crc32 = '\0';
  local_58.m_crc16 = 0;
  local_58.m_crc32 = 0;
  ON_BinaryArchive::GetCurrentChunk(archive,&local_58);
  local_80 = 0;
  local_74 = 0;
  p = (void *)0x0;
  if (local_6c != 1) goto LAB_00460151;
  bVar1 = ON_BinaryArchive::ReadBigInt(archive,&local_80);
  if ((bVar1) && (bVar1 = ON_BinaryArchive::ReadInt(archive,&local_74), iVar5 = local_70, bVar1)) {
    OVar3 = ON_3DM_BIG_CHUNK::Length(&local_58);
    if (iVar5 == 0) {
      if (OVar3 != local_80 + 0x18) {
        iVar5 = 0x51b;
        goto LAB_0046028b;
      }
    }
    else if (OVar3 < local_80 + 0x18) {
      iVar5 = 0x524;
LAB_0046028b:
      bVar6 = 0;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,iVar5,"","corrupt archive");
      goto LAB_0046014e;
    }
    if (local_80 != 0) {
      local_60 = 0x10000;
      if (local_80 < 0x10000) {
        local_60 = local_80;
      }
      p = onmalloc(local_60);
      if (p == (void *)0x0) {
        bVar6 = 0;
      }
      else {
        uVar4 = 0;
        while( true ) {
          bVar6 = 1;
          count = local_80 - uVar4;
          if (local_80 < uVar4 || count == 0) break;
          if (local_60 < count) {
            count = local_60;
          }
          local_68 = uVar4;
          bVar1 = ON_BinaryArchive::ReadByte(archive,count,p);
          if (!bVar1) {
            bVar6 = 0;
            break;
          }
          Write(this,count,p);
          uVar4 = local_68 + count;
        }
      }
      goto LAB_00460151;
    }
    bVar6 = 1;
  }
  else {
    bVar6 = 0;
  }
LAB_0046014e:
  p = (void *)0x0;
LAB_00460151:
  if (p != (void *)0x0) {
    onfree(p);
  }
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(archive);
  if ((bool)(bVar1 & bVar6) == true) {
    Compact(this);
    OVar2 = CRC32(this,0);
    if ((OVar2 != local_74) || (this->m_buffer_size != local_80)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x556,"","The buffer contents were corrupted during, writing, storage or reading."
                );
    }
  }
  else {
    ChangeSize(this,0);
  }
  return (bool)(bVar1 & bVar6);
}

Assistant:

bool ON_Buffer::ReadFromBinaryArchive( ON_BinaryArchive& archive )
{
  Destroy();
  
  int major_version = 0;
  int minor_version = 0;
  if ( !archive.BeginRead3dmChunk(TCODE_OPENNURBS_BUFFER,&major_version,&minor_version) )
    return false;

  ON_3DM_BIG_CHUNK c0;
  memset(&c0,0,sizeof(c0));
  archive.GetCurrentChunk(c0);

  ON__UINT64 saved_buffer_size = 0;
  ON__UINT32 saved_buffer_crc = 0;
  bool rc = false;
  void* a = 0;
  for(;;)
  {
    if ( 1 != major_version )
      break;
    
    if ( !archive.ReadBigInt(&saved_buffer_size) )
      break;

    if ( !archive.ReadInt(&saved_buffer_crc) )
      break;

    const ON__UINT64 extra_size = 24; // =
                                      //  4  ( major version number )
                                      // +4  ( minor version number )
                                      // +8  ( 64-bit buffer_size )
                                      // +4  ( 32-bit buffer_crc )
                                      // +4  ( 32-bit chunk crc )
    if ( 0 == minor_version )
    {
      if ( c0.Length() != extra_size + saved_buffer_size )
      {
        ON_ERROR("corrupt archive");
        break;
      }
    }
    else if ( c0.Length() < extra_size + saved_buffer_size )
    {
      // later versions may add more information
      // but there still needs to be enough room
      // to store the buffer.
      ON_ERROR("corrupt archive");
      break;
    }

    if ( saved_buffer_size > 0 )
    {
      ON__UINT64 a_capacity = saved_buffer_size;
      if ( a_capacity > 16*4096 )
        a_capacity = 16*4096;
      a = onmalloc((size_t)a_capacity);
      if ( 0 == a )
        break;
      ON__UINT64 size = 0;
      bool buffer_rc = true;
      while( size < saved_buffer_size )
      {
        ON__UINT64 read_size = a_capacity;
        if ( read_size > saved_buffer_size - size )
          read_size = saved_buffer_size - size;
        if ( !archive.ReadByte((size_t)read_size,a) )
        {
          buffer_rc = false;
          break;
        }
        // add to buffer
        Write(read_size,a);
        size += read_size;
      }
    
      if ( !buffer_rc )
        break;
    }

    rc = true;
    break;
  }

  if ( 0 != a )
    onfree(a);

  if ( !archive.EndRead3dmChunk() )
    rc = false;

  if ( rc )
  {
    Compact();
    const ON__UINT32 buffer_crc = CRC32(0);
    if ( buffer_crc != saved_buffer_crc || m_buffer_size != saved_buffer_size)
    {
      // The buffer's contents have been damaged.
      ON_ERROR("The buffer contents were corrupted during, writing, storage or reading.");
    }
  }
  else
  {
    Destroy();
  }

  return rc;
}